

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_grow(mbedtls_mpi *X,size_t nblimbs)

{
  ulong uVar1;
  mbedtls_mpi_uint *__dest;
  long lVar2;
  int iVar3;
  mbedtls_mpi_uint *__src;
  
  iVar3 = -0x10;
  if (nblimbs < 0x2711) {
    uVar1 = X->n;
    if (uVar1 < nblimbs) {
      __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
      if (__dest == (mbedtls_mpi_uint *)0x0) {
        return -0x10;
      }
      __src = X->p;
      if (__src != (mbedtls_mpi_uint *)0x0) {
        memcpy(__dest,__src,uVar1 * 8);
        if (uVar1 != 0) {
          lVar2 = 0;
          do {
            *(undefined1 *)((long)__src + lVar2) = 0;
            lVar2 = lVar2 + 1;
          } while (uVar1 * 8 - lVar2 != 0);
          __src = X->p;
        }
        free(__src);
      }
      X->n = nblimbs;
      X->p = __dest;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_grow( mbedtls_mpi *X, size_t nblimbs )
{
    mbedtls_mpi_uint *p;

    if( nblimbs > MBEDTLS_MPI_MAX_LIMBS )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    if( X->n < nblimbs )
    {
        if( ( p = mbedtls_calloc( nblimbs, ciL ) ) == NULL )
            return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

        if( X->p != NULL )
        {
            memcpy( p, X->p, X->n * ciL );
            mbedtls_zeroize( X->p, X->n * ciL );
            mbedtls_free( X->p );
        }

        X->n = nblimbs;
        X->p = p;
    }

    return( 0 );
}